

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  secp256k1_fe local_58;
  
  uVar107 = (a->z).n[0];
  uVar1 = (a->z).n[1];
  uVar2 = (a->z).n[3];
  uVar103 = uVar107 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar103;
  uVar3 = (a->z).n[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar1 * 2;
  uVar4 = (a->z).n[4];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar4;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar7 * auVar59,0);
  auVar5 = auVar8 * ZEXT816(0x1000003d10) + auVar6 * auVar58 + auVar5 * auVar57;
  uVar4 = uVar4 * 2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar107;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar1 * 2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar7 * auVar59,8);
  auVar8 = auVar12 * ZEXT816(0x1000003d10000) +
           auVar9 * auVar60 + auVar11 * auVar62 + auVar10 * auVar61 + (auVar5 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar107;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar107;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar3 * 2;
  auVar6 = auVar15 * auVar65 + auVar14 * auVar64 + (auVar8 >> 0x34);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar8._6_2_ & 0xf);
  auVar7 = auVar16 * ZEXT816(0x1000003d1) + auVar13 * auVar63;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar103;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar4;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar2;
  auVar6 = auVar19 * auVar68 + auVar18 * auVar67 + (auVar6 >> 0x34);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar9 = auVar20 * ZEXT816(0x1000003d10) + auVar17 * auVar66 + (auVar7 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar3;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar103;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar4;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar2;
  auVar6 = auVar23 * auVar71 + (auVar6 >> 0x34);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar6._0_8_;
  auVar10 = auVar24 * ZEXT816(0x1000003d10) + auVar22 * auVar70 + auVar21 * auVar69 +
            (auVar9 >> 0x34);
  auVar11 = auVar10 >> 0x34;
  auVar98._8_8_ = auVar11._8_8_;
  auVar98._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = auVar11._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar6._8_8_;
  auVar99 = auVar25 * ZEXT816(0x1000003d10000) + auVar98 + auVar99;
  uVar108 = auVar99._0_8_;
  uVar106 = (auVar99._8_8_ << 0xc | uVar108 >> 0x34) + (auVar8._0_8_ & 0xffffffffffff);
  uVar107 = x->n[3];
  uVar105 = auVar7._0_8_ & 0xfffffffffffff;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar105;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar107;
  uVar110 = auVar9._0_8_ & 0xfffffffffffff;
  uVar1 = x->n[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar110;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar1;
  uVar109 = auVar10._0_8_ & 0xfffffffffffff;
  uVar2 = x->n[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar109;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar2;
  uVar108 = uVar108 & 0xfffffffffffff;
  uVar3 = x->n[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar108;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar3;
  uVar4 = x->n[4];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar106;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar4;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SUB168(auVar30 * auVar76,0);
  auVar8 = auVar27 * auVar73 + auVar26 * auVar72 + auVar28 * auVar74 + auVar29 * auVar75 +
           auVar31 * ZEXT816(0x1000003d10);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar105;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar110;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar107;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar109;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar108;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar106;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar3;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SUB168(auVar30 * auVar76,8);
  auVar5 = auVar37 * ZEXT816(0x1000003d10000) +
           auVar36 * auVar81 +
           auVar35 * auVar80 + auVar34 * auVar79 + auVar33 * auVar78 + auVar32 * auVar77 +
           (auVar8 >> 0x34);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar105;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar3;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar110;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar4;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar109;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar107;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar108;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar106;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar2;
  auVar6 = auVar42 * auVar86 + auVar41 * auVar85 + auVar40 * auVar84 + auVar39 * auVar83 +
           (auVar5 >> 0x34);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
  auVar7 = auVar43 * ZEXT816(0x1000003d1) + auVar38 * auVar82;
  uVar103 = auVar7._0_8_;
  uVar104 = auVar7._8_8_;
  auVar97._8_8_ = uVar104 >> 0x34;
  auVar97._0_8_ = uVar104 * 0x1000 | uVar103 >> 0x34;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar105;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar110;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar3;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar109;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar4;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar108;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar107;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar106;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar1;
  auVar6 = auVar48 * auVar91 + auVar47 * auVar90 + auVar46 * auVar89 + (auVar6 >> 0x34);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar97 = auVar49 * ZEXT816(0x1000003d10) + auVar45 * auVar88 + auVar44 * auVar87 + auVar97;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar105;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar110;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar109;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar3;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar108;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar4;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar106;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar107;
  auVar6 = auVar54 * auVar96 + auVar53 * auVar95 + (auVar6 >> 0x34);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = auVar6._0_8_;
  auVar7 = auVar55 * ZEXT816(0x1000003d10) +
           auVar52 * auVar94 + auVar50 * auVar92 + auVar51 * auVar93 + (auVar97 >> 0x34);
  auVar9 = auVar7 >> 0x34;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = auVar9._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar6._8_8_;
  auVar100._8_8_ = auVar9._8_8_;
  auVar100._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar101 = auVar56 * ZEXT816(0x1000003d10000) + auVar100 + auVar101;
  uVar107 = auVar101._0_8_;
  local_58.n[0] = (0x3ffffbfffff0bc - (uVar103 & 0xfffffffffffff)) + (a->x).n[0];
  local_58.n[1] = (0x3ffffffffffffc - (auVar97._0_8_ & 0xfffffffffffff)) + (a->x).n[1];
  local_58.n[2] = (0x3ffffffffffffc - (auVar7._0_8_ & 0xfffffffffffff)) + (a->x).n[2];
  local_58.n[3] = (0x3ffffffffffffc - (uVar107 & 0xfffffffffffff)) + (a->x).n[3];
  local_58.n[4] =
       (0x3fffffffffffc -
       ((auVar101._8_8_ << 0xc | uVar107 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff))) + (a->x).n[4];
  iVar102 = secp256k1_fe_impl_normalizes_to_zero(&local_58);
  return iVar102;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;
    SECP256K1_FE_VERIFY(x);
    SECP256K1_GEJ_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal(&r, &a->x);
}